

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void genDotIntersect(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
                    pointSet *dots,float probeRad,float spikelen,int srcFlag,int targFlg,
                    dotNode *(*results) [7])

{
  int iVar1;
  atom *paVar2;
  bool bVar3;
  pointSet *dots_00;
  long lVar4;
  dotNode_t *pdVar5;
  dotNode *__ptr;
  dotNode *pdVar6;
  dotNode *pdVar7;
  long lVar8;
  int oktargsB;
  int local_54;
  int local_50;
  float local_4c;
  atom *local_48;
  pointSet *local_40;
  atomBins *local_38;
  
  local_54 = 1;
  local_50 = 1;
  local_4c = spikelen;
  local_40 = dots;
  local_38 = abins;
  if (Ldotdump == '\x01') {
    genDotIntersect_cold_1();
  }
  bVar3 = bbins != (atomBins *)0x0 && allMovingAtoms != (atom *)0x0;
  local_48 = allMainAtoms;
  if (allMainAtoms != (atom *)0x0) {
    do {
      if ((allMainAtoms->flags & srcFlag) != 0) {
        local_54 = 1;
        local_50 = 1;
        paVar2 = findTouchingAtoms(allMainAtoms,(atom *)0x0,local_38,probeRad,targFlg,&local_54);
        if (bVar3) {
          paVar2 = findTouchingAtoms(allMainAtoms,paVar2,bbins,probeRad,targFlg,&local_50);
        }
        if (Ldotdump == '\x01') {
          genDotIntersect_cold_2();
        }
        if ((paVar2 != (atom *)0x0) && ((local_54 != 0 || (local_50 != 0 && bVar3)))) {
          dots_00 = (pointSet *)(ulong)(uint)Maxbonded;
          markBonds(allMainAtoms,paVar2,1,Maxbonded);
          if (3 < Maxbonded) {
            fixupLongBondChains(allMainAtoms,paVar2,3);
          }
          iVar1 = dotType(allMainAtoms,paVar2,0);
          if (LOneDotEach == '\x01') {
            if (Ldotdump == '\x01') {
              genDotIntersect_cold_3();
            }
            examineOneDotEach(allMainAtoms,iVar1,paVar2,dots_00,probeRad,local_4c,targFlg,results,
                              local_48);
          }
          else {
            examineDots(allMainAtoms,iVar1,paVar2,local_40,probeRad,local_4c,targFlg,results);
          }
          if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
            genDotIntersect_cold_4();
          }
        }
      }
      allMainAtoms = allMainAtoms->next;
    } while (allMainAtoms != (atom_t *)0x0);
  }
  if (bVar3) {
    do {
      if ((allMovingAtoms->flags & srcFlag) != 0) {
        local_54 = 1;
        local_50 = 1;
        paVar2 = findTouchingAtoms(allMovingAtoms,(atom *)0x0,local_38,probeRad,targFlg,&local_54);
        paVar2 = findTouchingAtoms(allMovingAtoms,paVar2,bbins,probeRad,targFlg,&local_50);
        if ((paVar2 != (atom *)0x0) && (local_50 != 0 || local_54 != 0)) {
          markBonds(allMovingAtoms,paVar2,1,Maxbonded);
          if (3 < Maxbonded) {
            fixupLongBondChains(allMovingAtoms,paVar2,3);
          }
          iVar1 = dotType(allMovingAtoms,paVar2,0);
          examineDots(allMovingAtoms,iVar1,paVar2,local_40,probeRad,local_4c,targFlg,results);
          if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
            genDotIntersect_cold_5();
          }
        }
      }
      allMovingAtoms = allMovingAtoms->next;
    } while (allMovingAtoms != (atom_t *)0x0);
  }
  lVar4 = 0;
  do {
    lVar8 = 0;
    do {
      pdVar7 = results[lVar4][lVar8];
      if (pdVar7 != (dotNode *)0x0) {
        pdVar6 = (dotNode *)0x0;
        __ptr = pdVar7;
        do {
          if (((__ptr->a->altConf != ' ') && (__ptr->t->altConf != ' ')) ||
             (1.0 < __ptr->a->occ + __ptr->t->occ)) {
            pdVar5 = __ptr->next;
            pdVar6 = __ptr;
          }
          else {
            pdVar5 = __ptr->next;
            if (__ptr == pdVar7) {
              free(__ptr);
              pdVar6 = (dotNode *)0x0;
              pdVar7 = pdVar5;
            }
            else {
              pdVar6->next = pdVar5;
              free(__ptr);
              pdVar5 = pdVar6->next;
            }
          }
          __ptr = pdVar5;
        } while (pdVar5 != (dotNode_t *)0x0);
      }
      results[lVar4][lVar8] = pdVar7;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x72);
  return;
}

Assistant:

void genDotIntersect(atom *allMainAtoms, atomBins *abins,
			atom *allMovingAtoms, atomBins *bbins,
			pointSet dots[],
			float probeRad, float spikelen,
			int srcFlag, int targFlg, dotNode *results[][NODEWIDTH])
{/*genDotIntersect()*/

   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int type = 0, usesMovingAtoms = FALSE;
   int oktargsA = TRUE, oktargsB = TRUE;

    int i=0,j=0;/* SJ - 05/06/2015 moved the variables here from below for compatibility with windows C compiler*/ 
    atom *source = NULL, *target=NULL;
    dotNode *head = NULL, *curNode = NULL, *prevNode = NULL;

   if(Ldotdump) {
    fprintf(stderr,"entered genDotIntersect()\n");
   }

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) /*main==autobondrotstatic*/
   {/*for: loop over all main atoms taking each in turn as the src-atom*/

      if (src->flags & srcFlag)  /*dcr?: seems srcFlag always either 1 or 2 ??*/
      {/*for each src atom*/

          oktargsA = TRUE; oktargsB = TRUE;
          atomList = findTouchingAtoms(src, NULL,abins, probeRad, targFlg, &oktargsA);

           /*20111206 findTouchingAtoms() sets ~exactly overlapping atoms to be NOT oktargsA*/
           /*this is where too close things fail to show dots !! ?? */

          if (usesMovingAtoms) /*autobondrot*/
          {
	            atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, targFlg, &oktargsB);
	        }
	        else
          {
               atomList2 = atomList;
          }

          if(Ldotdump)
              fprintf(stderr,"findTouchingAtoms() sets oktargsA== %d \n",oktargsA);
          if (atomList2 && (oktargsA || (usesMovingAtoms && oktargsB) ))
          {
	           markBonds(src, atomList2, 1, Maxbonded); /*in genDotIntersect()*/
              /*markBonds identifies bonds between atoms - */
              /*seems not to have lower distance limit*/
              /*but this is where autobondrot fails to spike very close atoms*/

              if (Maxbonded > 3)
                   fixupLongBondChains(src, atomList2, 3);

	           type = dotType(src, atomList2, FALSE);

              if(LOneDotEach)
              {
                   if(Ldotdump)
                     fprintf(stderr,"genDotIntersect() calls examineOneDotEach()\n");
                
                   examineOneDotEach(src,type,atomList2,dots,probeRad,spikelen,targFlg,results,allMainAtoms);
                  /*allMainAtoms20120120*/
              }
              else
              {
                  examineDots(src, type, atomList2, dots, probeRad, spikelen, targFlg, results);
              }
              if(Verbose && ShowTicks)
              {
		            fprintf(stderr, "%s%d   \r",
			          src->r->resname, src->r->resid);
              }
          }
      }/*for each src atom*/
   }/*for: loop over all static atoms taking each in turn as the src-atom*/

   if(usesMovingAtoms)
   {/*if: usesMovingAtoms==autobondrot*/

      for(src = allMovingAtoms; src; src = src->next)
      {/*for: loop over allMovingAtoms taking each in turn as the src-atom*/

	       if (src->flags & srcFlag)  /*dcr?: what is being flagged here??*/
         {

	           oktargsA = TRUE;
              oktargsB = TRUE;
	           atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, targFlg, &oktargsA);
	           atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, targFlg, &oktargsB);
	           if (atomList2 && (oktargsA || oktargsB))
              {
	               markBonds(src, atomList2, 1, Maxbonded);
               /*markBonds identifies bonds between atoms - */
               /*seems not to have lower distance limit*/
              /*but is where autobondrot fails to spike very close atoms*/

	               if (Maxbonded > 3)
                       fixupLongBondChains(src, atomList2, 3);

                 type = dotType(src, atomList2, FALSE);

                  /*usesMovingAtoms==autobondrot does not use LOneDotEach option 111205*/
                 examineDots(src,type,atomList2,dots,probeRad,spikelen,targFlg,results);

	               if(Verbose && ShowTicks)
                 {
		                 fprintf(stderr, "%s%d   \r",
			              src->r->resname, src->r->resid);
                 }
	          }
	      }
      }/*for: loop over allMovingAtoms taking each in turn as the src-atom*/
   }/*if: usesMovingAtoms==autobondrot*/
    
    // SJ - 10/03/2014 - Code to delete contact dots (except H bonds) between atom pairs when atleast one of them has an altConf " " and the sum of their occpancies is <= 1
    // UNKNOWN BUGS: Not sure what this code will do if the results is genearted using autobondrot
    
    for(i=0;i<NUMATOMTYPES;i++)
    {/*loop over atom types*/
       // for(j=0;j<4;j++) // Old: first j:0-3 correspond to wc, cc, so, bo. Not looping over H-bond dotNode, last one is H bonds
        for(j=0; j< NODEWIDTH - 1; j++) // changed on 04/09/2015 SJ to accomodate for extra list for weak H bonds and worse overlaps
            /* see NODEWIDTH definition in probe.h - SJ*/
        {/*loop over wc, cc, weak H bonds (wh, if LweakHbonds is true), so, bo, and worse overlap (wo, if LworseOverlap is true)*/
            
            head = results[i][j];
            prevNode=NULL;
            curNode=head;
            while(curNode) // if the list is empty, it will not enter this loop
            {
                source = curNode->a;
                target = curNode->t;
                if((source->altConf == ' ' || target->altConf == ' ') && source->occ + target->occ <= 1)
                { //this node has to be deleted
                    if(curNode==head)
                    {
                        head=curNode->next;
                        free(curNode);
                        prevNode=NULL;
                        curNode=head;
                    }
                    else
                    {
                        prevNode->next=curNode->next;
                        free(curNode);
                        curNode=prevNode->next;
                    }
                }
                else
                {//move forward when no deletion
                    prevNode=curNode;
                    curNode=curNode->next;
                }
            }/*while loop*/
            results[i][j]=head;
        }/*loop over wc, cc, weak H bonds (wh, if LweakHbonds is true), so, bo, and worse overlap (wo, if LworseOverlap is true)*/
    }/*for loop over atomtypes*/
    //results now is filtered
    
}